

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void art_shrink_at(art_t *art,art_ref_t ref)

{
  _Bool _Var1;
  art_typecode_t aVar2;
  art_node_t *paVar3;
  art_ref_t aVar4;
  art_t *in_RSI;
  art_ref_t unaff_retaddr;
  art_t *in_stack_00000008;
  int i_3;
  art_node256_t *node256;
  uint8_t idx;
  int i_2;
  art_node48_t *node48;
  uint8_t i_1;
  art_node16_t *node16;
  uint8_t i;
  art_node4_t *node4;
  int local_4c;
  art_ref_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  byte bVar5;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar6;
  byte local_29;
  byte local_19;
  art_ref_t in_stack_ffffffffffffffe8;
  
  _Var1 = art_is_leaf(0x10b078);
  if (!_Var1) {
    aVar2 = art_ref_typecode((art_ref_t)in_RSI);
    switch(aVar2) {
    case '\x02':
      paVar3 = art_deref((art_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8);
      for (local_19 = 0; local_19 < *(byte *)((long)paVar3 + 6); local_19 = local_19 + 1) {
        aVar4 = art_move_node_to_shrink(in_stack_00000008,unaff_retaddr);
        *(art_ref_t *)((long)paVar3 + (ulong)local_19 * 8 + 0x10) = aVar4;
        art_shrink_at(in_RSI,(art_ref_t)paVar3);
      }
      break;
    case '\x03':
      paVar3 = art_deref((art_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8);
      for (local_29 = 0; local_29 < *(byte *)((long)paVar3 + 6); local_29 = local_29 + 1) {
        aVar4 = art_move_node_to_shrink(in_stack_00000008,unaff_retaddr);
        *(art_ref_t *)((long)paVar3 + (ulong)local_29 * 8 + 0x18) = aVar4;
        art_shrink_at(in_RSI,in_stack_ffffffffffffffe8);
      }
      break;
    case '\x04':
      paVar3 = art_deref((art_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8);
      for (iVar6 = 0; iVar6 < 0x100; iVar6 = iVar6 + 1) {
        if (*(char *)((long)paVar3 + (long)iVar6 + 0x10) != '0') {
          bVar5 = *(byte *)((long)paVar3 + (long)iVar6 + 0x10);
          aVar4 = art_move_node_to_shrink(in_stack_00000008,unaff_retaddr);
          *(art_ref_t *)((long)paVar3 + (ulong)bVar5 * 8 + 0x110) = aVar4;
          art_shrink_at(in_RSI,in_stack_ffffffffffffffe8);
        }
      }
      break;
    case '\x05':
      paVar3 = art_deref((art_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8);
      for (local_4c = 0; local_4c < 0x100; local_4c = local_4c + 1) {
        if (*(long *)((long)paVar3 + (long)local_4c * 8 + 8) != 0) {
          aVar4 = art_move_node_to_shrink(in_stack_00000008,unaff_retaddr);
          *(art_ref_t *)((long)paVar3 + (long)local_4c * 8 + 8) = aVar4;
          art_shrink_at(in_RSI,in_stack_ffffffffffffffe8);
        }
      }
    }
  }
  return;
}

Assistant:

static void art_shrink_at(art_t *art, art_ref_t ref) {
    if (art_is_leaf(ref)) {
        return;
    }
    switch (art_ref_typecode(ref)) {
        case CROARING_ART_NODE4_TYPE: {
            art_node4_t *node4 = (art_node4_t *)art_deref(art, ref);
            for (uint8_t i = 0; i < node4->count; ++i) {
                node4->children[i] =
                    art_move_node_to_shrink(art, node4->children[i]);
                art_shrink_at(art, node4->children[i]);
            }
        } break;
        case CROARING_ART_NODE16_TYPE: {
            art_node16_t *node16 = (art_node16_t *)art_deref(art, ref);
            for (uint8_t i = 0; i < node16->count; ++i) {
                node16->children[i] =
                    art_move_node_to_shrink(art, node16->children[i]);
                art_shrink_at(art, node16->children[i]);
            }
        } break;
        case CROARING_ART_NODE48_TYPE: {
            art_node48_t *node48 = (art_node48_t *)art_deref(art, ref);
            for (int i = 0; i < 256; ++i) {
                if (node48->keys[i] != CROARING_ART_NODE48_EMPTY_VAL) {
                    uint8_t idx = node48->keys[i];
                    node48->children[idx] =
                        art_move_node_to_shrink(art, node48->children[idx]);
                    art_shrink_at(art, node48->children[idx]);
                }
            }
        } break;
        case CROARING_ART_NODE256_TYPE: {
            art_node256_t *node256 = (art_node256_t *)art_deref(art, ref);
            for (int i = 0; i < 256; ++i) {
                if (node256->children[i] != CROARING_ART_NULL_REF) {
                    node256->children[i] =
                        art_move_node_to_shrink(art, node256->children[i]);
                    art_shrink_at(art, node256->children[i]);
                }
            }
        } break;
        default:
            assert(false);
            break;
    }
}